

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_frontend_test.cpp
# Opt level: O0

string * __thiscall test_app::str_abi_cxx11_(test_app *this)

{
  long lVar1;
  long in_RSI;
  string *in_RDI;
  size_t from;
  string *result;
  string local_70 [32];
  string local_50 [55];
  undefined1 local_19;
  long local_18;
  
  cppcms::application::response();
  cppcms::http::response::finalize();
  local_18 = std::__cxx11::string::find((char *)(in_RSI + 0x28),0x12e365);
  local_19 = 0;
  std::__cxx11::string::string(in_RDI);
  if (local_18 == -1) {
    std::__cxx11::string::operator=(in_RDI,(string *)(in_RSI + 0x28));
    *(undefined1 *)(in_RSI + 0x48) = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,in_RSI + 0x28);
    std::__cxx11::string::operator=(in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::substr((ulong)local_70,in_RSI + 0x28);
    lVar1 = std::__cxx11::string::find((char *)local_70,0x12e36a);
    *(bool *)(in_RSI + 0x48) = lVar1 != -1;
    std::__cxx11::string::~string(local_70);
  }
  std::__cxx11::string::clear();
  return in_RDI;
}

Assistant:

std::string str()
	{
		response().finalize();
		size_t from = output_.find("\r\n\r\n");
		std::string result;
		if(from==std::string::npos) {
			result = output_;
			gzip_ = false;
		}
		else {
			result = output_.substr(from+4);
			gzip_ = output_.substr(0,from).find("gzip")!=std::string::npos;
		}
		output_.clear();
		return result;
	}